

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall
ASDCP::MXF::PIMFDynamicMetadataDescriptor::PIMFDynamicMetadataDescriptor
          (PIMFDynamicMetadataDescriptor *this,Dictionary *d)

{
  byte_t *value;
  UL local_38;
  Dictionary *local_18;
  Dictionary *d_local;
  PIMFDynamicMetadataDescriptor *this_local;
  
  local_18 = d;
  d_local = (Dictionary *)this;
  GenericDataEssenceDescriptor::GenericDataEssenceDescriptor
            (&this->super_GenericDataEssenceDescriptor,d);
  (this->super_GenericDataEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
  super_InterchangeObject.super_KLVPacket._vptr_KLVPacket =
       (_func_int **)&PTR__PIMFDynamicMetadataDescriptor_0033bde0;
  this->GlobalPayloadSID = 0;
  if ((this->super_GenericDataEssenceDescriptor).super_FileDescriptor.super_GenericDescriptor.
      super_InterchangeObject.m_Dict != (Dictionary *)0x0) {
    value = Dictionary::ul((this->super_GenericDataEssenceDescriptor).super_FileDescriptor.
                           super_GenericDescriptor.super_InterchangeObject.m_Dict,
                           MDD_PIMFDynamicMetadataDescriptor);
    UL::UL(&local_38,value);
    UL::operator=(&(this->super_GenericDataEssenceDescriptor).super_FileDescriptor.
                   super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.m_UL,&local_38);
    UL::~UL(&local_38);
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x1401,
                "ASDCP::MXF::PIMFDynamicMetadataDescriptor::PIMFDynamicMetadataDescriptor(const Dictionary *)"
               );
}

Assistant:

PIMFDynamicMetadataDescriptor::PIMFDynamicMetadataDescriptor(const Dictionary* d) : GenericDataEssenceDescriptor(d), GlobalPayloadSID(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_PIMFDynamicMetadataDescriptor);
}